

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropon.c
# Opt level: O3

void mj_free_component(mj_component_t *c)

{
  long lVar1;
  
  if (c != (mj_component_t *)0x0) {
    if (0 < c->nblocks) {
      lVar1 = 0;
      do {
        free(c->blocks[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < c->nblocks);
    }
    free(c->blocks);
    return;
  }
  return;
}

Assistant:

void mj_free_component(mj_component_t *c) {
    if(c == NULL) {
        return;
    }

    int i;

    for(i = 0; i < c->nblocks; i++) {
        free(c->blocks[i]);
    }

    free(c->blocks);

    return;
}